

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O3

BOOL __thiscall Js::JavascriptProxy::IsWritable(JavascriptProxy *this,PropertyId propertyId)

{
  ScriptContext *requestContext;
  bool bVar1;
  BOOL BVar2;
  uint uVar3;
  JavascriptProxy *this_00;
  undefined1 local_58 [8];
  PropertyDescriptor propertyDescriptor;
  
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_58);
  requestContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  this_00 = VarTo<Js::JavascriptProxy,Js::RecyclableObject>((RecyclableObject *)this);
  BVar2 = GetPropertyDescriptorTrap
                    (this_00,propertyId,(PropertyDescriptor *)local_58,requestContext);
  uVar3 = 0;
  if ((BVar2 != 0) && ((char)propertyDescriptor.originalVar.ptr == '\x01')) {
    bVar1 = PropertyDescriptor::IsWritable((PropertyDescriptor *)local_58);
    uVar3 = (uint)bVar1;
  }
  return uVar3;
}

Assistant:

BOOL JavascriptProxy::IsWritable(PropertyId propertyId)
    {
        PropertyDescriptor propertyDescriptor;
        if (!GetOwnPropertyDescriptor(this, propertyId, GetScriptContext(), &propertyDescriptor))
        {
            return FALSE;
        }

        // If property descriptor has getter/setter we should check if writable is specified before checking IsWritable
        return propertyDescriptor.WritableSpecified() ? propertyDescriptor.IsWritable() : FALSE;
    }